

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

Map<bool,_bool> * __thiscall
google::protobuf::internal::TypeDefinedMapFieldBase<bool,_bool>::MutableMap
          (TypeDefinedMapFieldBase<bool,_bool> *this)

{
  TypeDefinedMapFieldBase<bool,_bool> *this_local;
  
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  MapFieldBase::SetMapDirty(&this->super_MapFieldBase);
  return (Map<bool,_bool> *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }